

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O3

void __thiscall QtMWidgets::TableViewCellLayout::minimumSize(TableViewCellLayout *this)

{
  minimumSize((TableViewCellLayout *)&this[-1].detailedTextLabel);
  return;
}

Assistant:

QSize
TableViewCellLayout::minimumSize() const
{
	const QSize imageSize = imageLabel->minimumSizeHint();

	int width = imageSize.width();
	int height = imageSize.height();

	const QSize textSize = textLabel->minimumSizeHint();
	const QSize detailedTextSize = detailedTextLabel->minimumSizeHint();

	width += qMax( textSize.width(), detailedTextSize.width() );
	height = qMax( height,
		textSize.height() + detailedTextSize.height() );

	const QSize accessorySize = accessoryWidget->minimumSizeHint();

	width += accessorySize.width();
	height = qMax( height, accessorySize.height() );

	return QSize( width + contentsMargins().left() + contentsMargins().right(),
		height + contentsMargins().top() + contentsMargins().bottom() );
}